

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsLiveAt(VmInstruction *inst,VmInstruction *point)

{
  VmBlock *pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  pVVar1 = point->parent;
  if (pVVar1 == inst->parent) {
    bVar2 = IsAfter(inst,point);
    if (!bVar2) {
      uVar3 = (ulong)(pVVar1->liveOut).count;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          if ((pVVar1->liveOut).data[uVar4] == inst) {
            return true;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        if (point == (VmInstruction *)0x0) {
          return false;
        }
      }
      do {
        uVar3 = (ulong)(point->arguments).count;
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            if ((VmInstruction *)(point->arguments).data[uVar4] == inst) {
              return true;
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        point = point->nextSibling;
      } while (point != (VmInstruction *)0x0);
      return false;
    }
  }
  else {
    uVar3 = (ulong)(pVVar1->liveIn).count;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        if ((pVVar1->liveIn).data[uVar4] == inst) {
          uVar3 = (ulong)(pVVar1->liveOut).count;
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              if ((pVVar1->liveOut).data[uVar4] == inst) {
                return true;
              }
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (point == (VmInstruction *)0x0) {
            return false;
          }
          do {
            uVar3 = (ulong)(point->arguments).count;
            if (uVar3 != 0) {
              uVar4 = 0;
              do {
                if ((VmInstruction *)(point->arguments).data[uVar4] == inst) {
                  return true;
                }
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
            }
            point = point->nextSibling;
          } while (point != (VmInstruction *)0x0);
          return false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return false;
}

Assistant:

bool IsLiveAt(VmInstruction *inst, VmInstruction *point)
{
	VmBlock *definitionBlock = inst->parent;

	VmBlock *pointBlock = point->parent;

	// If both instructions are in the same block
	if(pointBlock == definitionBlock)
	{
		// If definition is after the point, then it's not live yet
		if(IsAfter(inst, point))
			return false;

		// If definition is before the point, we must find out if it's live yet

		// If it's live-out, then it's live at point
		for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
		{
			if(pointBlock->liveOut[i] == inst)
				return true;
		}

		// Check if it's used at point or after it
		VmInstruction *curr = point;

		while(curr)
		{
			for(unsigned i = 0; i < curr->arguments.size(); i++)
			{
				if(curr->arguments[i] == inst)
					return true;
			}

			curr = curr->nextSibling;
		}
	}
	else
	{
		// If instruction is not live-in at point block then it's not live
		bool liveIn = false;

		for(unsigned i = 0; i < pointBlock->liveIn.size(); i++)
		{
			if(pointBlock->liveIn[i] == inst)
			{
				liveIn = true;
				break;
			}
		}

		if(liveIn)
		{
			// If it's live-out, then it's live at point
			for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
			{
				if(pointBlock->liveOut[i] == inst)
					return true;
			}

			// Check if it's used at point or after it
			VmInstruction *curr = point;

			while(curr)
			{
				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					if(curr->arguments[i] == inst)
						return true;
				}

				curr = curr->nextSibling;
			}
		}
	}

	return false;
}